

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-sign.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  undefined8 uVar2;
  char cVar3;
  char *__s;
  size_t sVar4;
  int iVar5;
  string plain;
  string key;
  string filename;
  ofstream ascFile;
  ofstream os;
  ifstream textFile;
  ifstream keyFile;
  undefined1 auStack_8e8 [8];
  undefined1 *local_8e0;
  long local_8d8;
  undefined1 local_8d0;
  undefined7 uStack_8cf;
  undefined1 *local_8c0;
  long local_8b8;
  undefined1 local_8b0;
  undefined7 uStack_8af;
  long *local_8a0 [2];
  long local_890 [2];
  long *local_880 [2];
  long local_870 [2];
  long *local_860 [2];
  long local_850 [2];
  long *local_840;
  filebuf local_838 [8];
  ostream local_830 [112];
  ios_base local_7c0 [120];
  ios_base local_748 [264];
  long *local_640;
  filebuf local_638 [8];
  long local_630 [2];
  uint auStack_620 [54];
  ios_base local_548 [264];
  char local_440 [16];
  streambuf local_430 [504];
  char local_238 [16];
  streambuf local_228 [504];
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    iVar5 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: rsa-sign <private key> <text file>",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
  }
  else {
    local_8b8 = 0;
    local_8b0 = 0;
    local_8d8 = 0;
    local_8d0 = 0;
    local_8e0 = &local_8d0;
    local_8c0 = &local_8b0;
    std::ifstream::ifstream(local_238);
    std::ifstream::ifstream(local_440);
    std::ifstream::open(local_238,(_Ios_Openmode)argv[1]);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_840);
      std::ostream::operator<<(local_830,local_228);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_8c0,(string *)&local_640);
      if (local_640 != local_630) {
        operator_delete(local_640,local_630[0] + 1);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_840);
      std::ios_base::~ios_base(local_7c0);
    }
    std::ifstream::open(local_440,(_Ios_Openmode)argv[2]);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_840);
      std::ostream::operator<<(local_830,local_430);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_8e0,(string *)&local_640);
      if (local_640 != local_630) {
        operator_delete(local_640,local_630[0] + 1);
      }
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_840);
      std::ios_base::~ios_base(local_7c0);
    }
    if ((local_8b8 == 0) || (local_8d8 == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Missing key or text.",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      iVar5 = 1;
      std::ostream::flush();
    }
    else {
      local_860[0] = local_850;
      std::__cxx11::string::_M_construct<char*>((string *)local_860,local_8c0,local_8c0 + local_8b8)
      ;
      local_880[0] = local_870;
      std::__cxx11::string::_M_construct<char*>((string *)local_880,local_8e0,local_8e0 + local_8d8)
      ;
      __s = (char *)VerifyRSA::sign(local_860,local_880);
      if (local_880[0] != local_870) {
        operator_delete(local_880[0],local_870[0] + 1);
      }
      if (local_860[0] != local_850) {
        operator_delete(local_860[0],local_850[0] + 1);
      }
      std::ofstream::ofstream(&local_840);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_8a0,argv[2],(allocator<char> *)&local_640);
      std::__cxx11::string::append((char *)local_8a0);
      std::ofstream::ofstream(&local_640,(char *)local_8a0[0],_S_out);
      if ((*(uint *)((long)auStack_620 + local_640[-3]) & 5) == 0) {
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_8e8 + (int)local_640[-3] + 0x2a8);
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_640,__s,sVar4);
        }
        iVar5 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to write signature!",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        iVar5 = 1;
        std::ostream::flush();
      }
      uVar2 = ___cxa_atexit;
      plVar1 = _VTT;
      local_640 = _VTT;
      *(undefined8 *)(local_638 + _VTT[-3] + -8) = ___cxa_atexit;
      std::filebuf::~filebuf(local_638);
      std::ios_base::~ios_base(local_548);
      if (local_8a0[0] != local_890) {
        operator_delete(local_8a0[0],local_890[0] + 1);
      }
      local_840 = plVar1;
      *(undefined8 *)(local_838 + plVar1[-3] + -8) = uVar2;
      std::filebuf::~filebuf(local_838);
      std::ios_base::~ios_base(local_748);
    }
    std::ifstream::~ifstream(local_440);
    std::ifstream::~ifstream(local_238);
    if (local_8e0 != &local_8d0) {
      operator_delete(local_8e0,CONCAT71(uStack_8cf,local_8d0) + 1);
    }
    if (local_8c0 != &local_8b0) {
      operator_delete(local_8c0,CONCAT71(uStack_8af,local_8b0) + 1);
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-sign <private key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain;
    std::ifstream keyFile, textFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }

    if (key.empty() || plain.empty()) {
        std::cerr << "Missing key or text." << std::endl;
        return 1;
    }

    char* signature = VerifyRSA::sign(key, plain);
    if (sizeof(signature)<1) {
        std::cerr << "Unable to sign file!" << std::endl;
        return 1;
    }

    std::ofstream ascFile;
    std::string filename = argv[2];
    filename.append(".asc");
    std::ofstream os(filename.c_str());
    if (!os) {
        std::cerr << "Failed to write signature!" << std::endl;
        return 1;
    }
    else { os << signature; }
    return 0;
}